

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct32_stage5_avx2(__m256i *bf1,__m256i *cospim16,__m256i *cospi48,__m256i *cospi16,
                       __m256i *cospim48,__m256i *clamp_lo,__m256i *clamp_hi,__m256i *rounding,
                       int bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i alVar3;
  __m256i alVar4;
  
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[9],(undefined1  [32])*cospim16);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0xe],(undefined1  [32])*cospi48);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpmulld_avx2((undefined1  [32])*cospi48,(undefined1  [32])bf1[9]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0xe],(undefined1  [32])*cospi16);
  auVar1 = vpaddd_avx2((undefined1  [32])*rounding,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  bf1[0xe] = alVar4;
  bf1[9] = alVar3;
  auVar1 = vpmulld_avx2((undefined1  [32])bf1[10],(undefined1  [32])*cospim48);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0xd],(undefined1  [32])*cospim16);
  auVar1 = vpaddd_avx2(auVar2,auVar1);
  auVar1 = vpaddd_avx2(auVar1,(undefined1  [32])*rounding);
  alVar3 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  auVar1 = vpmulld_avx2((undefined1  [32])*cospim16,(undefined1  [32])bf1[10]);
  auVar2 = vpmulld_avx2((undefined1  [32])bf1[0xd],(undefined1  [32])*cospi48);
  auVar1 = vpaddd_avx2((undefined1  [32])*rounding,auVar1);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  alVar4 = (__m256i)vpsrad_avx2(auVar1,ZEXT416((uint)bit));
  bf1[0xd] = alVar4;
  bf1[10] = alVar3;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x13],(undefined1  [32])bf1[0x10]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0x10],(undefined1  [32])bf1[0x13]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x10] = alVar3;
  bf1[0x13] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x12],(undefined1  [32])bf1[0x11]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0x11],(undefined1  [32])bf1[0x12]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x11] = alVar3;
  bf1[0x12] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x14],(undefined1  [32])bf1[0x17]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0x17],(undefined1  [32])bf1[0x14]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x17] = alVar3;
  bf1[0x14] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x15],(undefined1  [32])bf1[0x16]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0x16],(undefined1  [32])bf1[0x15]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x16] = alVar3;
  bf1[0x15] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1b],(undefined1  [32])bf1[0x18]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0x18],(undefined1  [32])bf1[0x1b]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x18] = alVar3;
  bf1[0x1b] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1a],(undefined1  [32])bf1[0x19]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0x19],(undefined1  [32])bf1[0x1a]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x19] = alVar3;
  bf1[0x1a] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1c],(undefined1  [32])bf1[0x1f]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0x1f],(undefined1  [32])bf1[0x1c]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x1f] = alVar3;
  bf1[0x1c] = alVar4;
  auVar1 = vpaddd_avx2((undefined1  [32])bf1[0x1d],(undefined1  [32])bf1[0x1e]);
  auVar2 = vpsubd_avx2((undefined1  [32])bf1[0x1e],(undefined1  [32])bf1[0x1d]);
  auVar1 = vpmaxsd_avx2(auVar1,(undefined1  [32])*clamp_lo);
  alVar3 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  auVar1 = vpmaxsd_avx2(auVar2,(undefined1  [32])*clamp_lo);
  alVar4 = (__m256i)vpminsd_avx2(auVar1,(undefined1  [32])*clamp_hi);
  bf1[0x1e] = alVar3;
  bf1[0x1d] = alVar4;
  return;
}

Assistant:

static inline void idct32_stage5_avx2(
    __m256i *bf1, const __m256i *cospim16, const __m256i *cospi48,
    const __m256i *cospi16, const __m256i *cospim48, const __m256i *clamp_lo,
    const __m256i *clamp_hi, const __m256i *rounding, int bit) {
  __m256i temp1, temp2;
  temp1 = half_btf_avx2(cospim16, &bf1[9], cospi48, &bf1[14], rounding, bit);
  bf1[14] = half_btf_avx2(cospi48, &bf1[9], cospi16, &bf1[14], rounding, bit);
  bf1[9] = temp1;

  temp2 = half_btf_avx2(cospim48, &bf1[10], cospim16, &bf1[13], rounding, bit);
  bf1[13] = half_btf_avx2(cospim16, &bf1[10], cospi48, &bf1[13], rounding, bit);
  bf1[10] = temp2;

  addsub_avx2(bf1[16], bf1[19], bf1 + 16, bf1 + 19, clamp_lo, clamp_hi);
  addsub_avx2(bf1[17], bf1[18], bf1 + 17, bf1 + 18, clamp_lo, clamp_hi);
  addsub_avx2(bf1[23], bf1[20], bf1 + 23, bf1 + 20, clamp_lo, clamp_hi);
  addsub_avx2(bf1[22], bf1[21], bf1 + 22, bf1 + 21, clamp_lo, clamp_hi);
  addsub_avx2(bf1[24], bf1[27], bf1 + 24, bf1 + 27, clamp_lo, clamp_hi);
  addsub_avx2(bf1[25], bf1[26], bf1 + 25, bf1 + 26, clamp_lo, clamp_hi);
  addsub_avx2(bf1[31], bf1[28], bf1 + 31, bf1 + 28, clamp_lo, clamp_hi);
  addsub_avx2(bf1[30], bf1[29], bf1 + 30, bf1 + 29, clamp_lo, clamp_hi);
}